

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_emit.cc
# Opt level: O2

string * __thiscall
re2c::output_yych_abi_cxx11_(string *__return_storage_ptr__,re2c *this,bool *readCh)

{
  opt_t *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  if (*this == (re2c)0x1) {
    *this = (re2c)0x0;
    poVar1 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    InputAPI::expr_peek_save_abi_cxx11_(&local_30,&poVar1->input_api);
    std::operator+(&local_50,"(",&local_30);
    std::operator+(__return_storage_ptr__,&local_50,")");
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    poVar1 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&poVar1->yych);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string output_yych (bool & readCh)
{
	if (readCh)
	{
		readCh = false;
		return "(" + opts->input_api.expr_peek_save () + ")";
	}
	else
	{
		return opts->yych;
	}
}